

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O2

void set_report(parse_t *ps,char *dest)

{
  pmtr_t *ppVar1;
  ctor_f *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  UT_array *pUVar8;
  uint uVar9;
  char *pcVar10;
  UT_string *pUVar11;
  bool bVar12;
  int fd;
  in_addr_t dest_ip;
  int port;
  char *iface;
  in_addr iface_addr;
  ifreq ifr;
  sockaddr_in sin;
  
  iVar3 = parse_spec(ps->cfg,ps->em,dest,&dest_ip,&port,&iface);
  if (iVar3 != 0) goto LAB_00106653;
  if (ps->cfg->test_only != 0) {
    return;
  }
  iVar3 = socket(2,2,0);
  fd = iVar3;
  if (iVar3 == -1) {
    pUVar11 = ps->em;
    pcVar10 = "can\'t open file descriptor";
  }
  else {
    uVar4 = fcntl(iVar3,1);
    iVar5 = fcntl(iVar3,2,(ulong)(uVar4 | 1));
    if (iVar5 == -1) goto LAB_00106653;
    gethostname(ps->cfg->report_id,100);
    pcVar10 = iface;
    if (iface == (char *)0x0) {
LAB_0010681c:
      sin.sin_family = 2;
      sin.sin_addr.s_addr = dest_ip;
      sin.sin_port = (ushort)port << 8 | (ushort)port >> 8;
      iVar3 = connect(iVar3,(sockaddr *)&sin,0x10);
      if (iVar3 != -1) {
        pUVar8 = ps->cfg->report;
        uVar4 = pUVar8->n;
        uVar9 = pUVar8->i + 1;
        if (uVar4 < uVar9) {
          while (uVar4 < uVar9) {
            bVar12 = uVar4 == 0;
            uVar4 = uVar4 * 2;
            if (bVar12) {
              uVar4 = 8;
            }
            pUVar8->n = uVar4;
          }
          pcVar10 = (char *)realloc(pUVar8->d,(ulong)uVar4 * (pUVar8->icd).sz);
          ppVar1 = ps->cfg;
          ppVar1->report->d = pcVar10;
          if (pcVar10 == (char *)0x0) {
            exit(-1);
          }
          pUVar8 = ppVar1->report;
        }
        pcVar2 = (pUVar8->icd).copy;
        sVar6 = (pUVar8->icd).sz;
        uVar4 = pUVar8->i;
        pUVar8->i = uVar4 + 1;
        if (pcVar2 != (ctor_f *)0x0) {
          (*pcVar2)(pUVar8->d + uVar4 * sVar6,&fd);
          return;
        }
        memcpy(pUVar8->d + uVar4 * sVar6,&fd,sVar6);
        return;
      }
      pUVar11 = ps->em;
      piVar7 = __errno_location();
      pcVar10 = strerror(*piVar7);
      utstring_printf(pUVar11,"can\'t connect to %s: %s",dest,pcVar10);
      goto LAB_00106653;
    }
    sVar6 = strlen(iface);
    if ((int)sVar6 < 0x10) {
      ifr.ifr_ifru.ifru_addr.sa_family = 2;
      memcpy(&ifr,pcVar10,(long)((int)sVar6 + 1));
      iVar5 = ioctl(iVar3,0x8913,&ifr);
      if (iVar5 == 0) {
        if ((ifr.ifr_ifru.ifru_addr.sa_family & 0x1000) == 0) {
          pUVar11 = ps->em;
          pcVar10 = "%s does not multicast\n";
        }
        else {
          iVar5 = ioctl(iVar3,0x8915,&ifr);
          if (iVar5 == 0) {
            iface_addr.s_addr = ifr.ifr_ifru.ifru_map.mem_start._4_4_;
            ppVar1 = ps->cfg;
            sVar6 = strlen(ppVar1->report_id);
            pcVar10 = ppVar1->report_id + sVar6;
            pcVar10[0] = ' ';
            pcVar10[1] = '\0';
            ppVar1 = ps->cfg;
            pcVar10 = inet_ntoa((in_addr)ifr.ifr_ifru.ifru_map.mem_start._4_4_);
            strcat(ppVar1->report_id,pcVar10);
            iVar5 = setsockopt(iVar3,0,0x20,&iface_addr,4);
            if (iVar5 == 0) goto LAB_0010681c;
            pcVar10 = "setsockopt: %s\n";
          }
          else {
            pcVar10 = "ioctl: %s\n";
          }
          pUVar11 = ps->em;
          piVar7 = __errno_location();
          iface = strerror(*piVar7);
        }
      }
      else {
        pUVar11 = ps->em;
        piVar7 = __errno_location();
        iface = strerror(*piVar7);
        pcVar10 = "ioctl: %s\n";
      }
      utstring_printf(pUVar11,pcVar10,iface);
      goto LAB_00106653;
    }
    pUVar11 = ps->em;
    pcVar10 = "interface too long\n";
  }
  utstring_printf(pUVar11,pcVar10);
LAB_00106653:
  utstring_printf(ps->em," at line %d",(ulong)(uint)ps->line);
  ps->rc = -1;
  return;
}

Assistant:

void set_report(parse_t *ps, char *dest) { 
  int rc = -1, port, flags;
  in_addr_t dest_ip;
  char *iface;

  if (parse_spec(ps->cfg, ps->em, dest, &dest_ip, &port, &iface)) goto done;
  if (ps->cfg->test_only) return;  /* syntax looked ok */

  int fd = socket(AF_INET, SOCK_DGRAM, 0);
  if (fd == -1) {rc = -2; goto done;}

  /* set close-on-exec flag for the descriptor so our jobs don't inherit it */
  flags = fcntl(fd, F_GETFD);
  flags |= FD_CLOEXEC;
  if (fcntl(fd, F_SETFD, flags) == -1) {rc = -3; goto done;}

  gethostname(ps->cfg->report_id, sizeof(ps->cfg->report_id));

  /* use a specific NIC if one was specified, supported here for multicast */
  if (iface) {
    int l = strlen(iface);
    if (l+1 >IFNAMSIZ) {utstring_printf(ps->em,"interface too long\n"); goto done;}

    struct ifreq ifr;
    ifr.ifr_addr.sa_family = AF_INET;
    memcpy(ifr.ifr_name, iface, l+1);

    /* does this interface support multicast? */
    if (ioctl(fd, SIOCGIFFLAGS, &ifr)) {utstring_printf(ps->em,"ioctl: %s\n", strerror(errno)); goto done;} 
    if (!(ifr.ifr_flags & IFF_MULTICAST)) {utstring_printf(ps->em,"%s does not multicast\n",iface); goto done;}

    /* get the interface IP address */
    struct in_addr iface_addr;
    if (ioctl(fd, SIOCGIFADDR, &ifr)) {utstring_printf(ps->em,"ioctl: %s\n", strerror(errno)); goto done;} 
    iface_addr = (((struct sockaddr_in *)&ifr.ifr_addr)->sin_addr);
    // utstring_printf(ps->em,"iface %s has addr %s\n", iface, inet_ntoa(iface_addr));
    strcat(ps->cfg->report_id, " ");
    strcat(ps->cfg->report_id, inet_ntoa(iface_addr));

    /* ask kernel to use its IP address for outgoing multicast */
    if (setsockopt(fd, IPPROTO_IP, IP_MULTICAST_IF, &iface_addr, sizeof(iface_addr))) {
      utstring_printf(ps->em,"setsockopt: %s\n", strerror(errno));
      goto done;
    }
  }


  /* specify the local address and port  */
  struct sockaddr_in sin;
  sin.sin_family = AF_INET;
  sin.sin_addr.s_addr = dest_ip;
  sin.sin_port = htons(port);

  if (connect(fd, (struct sockaddr*)&sin, sizeof(sin)) == -1) {
    utstring_printf(ps->em, "can't connect to %s: %s", dest, strerror(errno));
    rc = -3;
    goto done;
  }

  /* success */
  utarray_push_back(ps->cfg->report, &fd);
  rc = 0;

 done:
  if (rc == -1) { /* ps->em already set */ }
  if (rc == -2) utstring_printf(ps->em,"can't open file descriptor");
  if (rc == -3) { /* ps->em already set */ }
  if (rc < 0) {
    utstring_printf(ps->em, " at line %d", ps->line);
    ps->rc = -1;
  }
}